

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::checkGroupCountFixture::checkGroupCountFixture
          (checkGroupCountFixture *this)

{
  allocator<char> local_419;
  string local_418;
  DataDictionary groupDD;
  
  FIX::DataDictionary::DataDictionary(&this->object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&groupDD,"FIX.4.2",(allocator<char> *)&local_418);
  FIX::DataDictionary::setVersion(&this->object,(string *)&groupDD);
  std::__cxx11::string::~string((string *)&groupDD);
  FIX::DataDictionary::addField(&this->object,8);
  FIX::DataDictionary::addField(&this->object,9);
  FIX::DataDictionary::addField(&this->object,0x23);
  FIX::DataDictionary::addField(&this->object,10);
  FIX::DataDictionary::addField(&this->object,0x4e);
  FIX::DataDictionary::DataDictionary(&groupDD);
  FIX::DataDictionary::addField(&groupDD,0x4f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"D",&local_419);
  FIX::DataDictionary::addGroup(&this->object,&local_418,0x4e,0x4f,&groupDD);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"D",&local_419);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->field_0xd0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"D",&local_419);
  FIX::DataDictionary::addMsgField(&this->object,&local_418,0x4e);
  std::__cxx11::string::~string((string *)&local_418);
  FIX::DataDictionary::~DataDictionary(&groupDD);
  return;
}

Assistant:

checkGroupCountFixture()
  {
    object.setVersion( BeginString_FIX42 );
    object.addField( FIELD::BeginString );
    object.addField( FIELD::BodyLength );
    object.addField( FIELD::MsgType );
    object.addField( FIELD::CheckSum );
    object.addField( FIELD::NoAllocs );
    DataDictionary groupDD;
    groupDD.addField( FIELD::AllocAccount );
    object.addGroup( "D", FIELD::NoAllocs, FIELD::AllocAccount, groupDD );
    object.addMsgType( MsgType_NewOrderSingle );
    object.addMsgField( MsgType_NewOrderSingle, FIELD::NoAllocs );
  }